

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode Curl_multi_add_perform(Curl_multi *multi,Curl_easy *data,connectdata *conn)

{
  CURLMcode CVar1;
  SingleRequest *k;
  CURLMcode rc;
  connectdata *conn_local;
  Curl_easy *data_local;
  Curl_multi *multi_local;
  
  CVar1 = curl_multi_add_handle(multi,data);
  if (CVar1 == CURLM_OK) {
    Curl_init_do(data,(connectdata *)0x0);
    mstate(data,CURLM_STATE_PERFORM);
    data->easy_conn = conn;
    (data->req).keepon = (data->req).keepon | 1;
  }
  return CVar1;
}

Assistant:

CURLMcode Curl_multi_add_perform(struct Curl_multi *multi,
                                 struct Curl_easy *data,
                                 struct connectdata *conn)
{
  CURLMcode rc;

  rc = curl_multi_add_handle(multi, data);
  if(!rc) {
    struct SingleRequest *k = &data->req;

    /* pass in NULL for 'conn' here since we don't want to init the
       connection, only this transfer */
    Curl_init_do(data, NULL);

    /* take this handle to the perform state right away */
    multistate(data, CURLM_STATE_PERFORM);
    data->easy_conn = conn;
    k->keepon |= KEEP_RECV; /* setup to receive! */
  }
  return rc;
}